

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixel.h
# Opt level: O2

type dlib::assign_pixel_helpers::assign<dlib::rgb_pixel,dlib::hsi_pixel>
               (rgb_pixel *dest,hsi_pixel *src)

{
  ushort uVar1;
  HSL c1;
  undefined1 auVar2 [16];
  undefined8 uStack_38;
  double dStack_30;
  double local_28;
  double local_20;
  double local_18;
  
  uVar1._0_1_ = src->s;
  uVar1._1_1_ = src->i;
  auVar2._0_8_ = (double)(uVar1 & 0xff);
  auVar2._8_8_ = (double)(byte)uVar1._1_1_;
  auVar2 = divpd(auVar2,_DAT_002df980);
  dStack_30 = auVar2._8_8_;
  uStack_38 = auVar2._0_8_;
  c1.s = (double)uStack_38;
  c1.h = ((double)src->h / 255.0) * 360.0;
  c1.l = dStack_30;
  HSL2RGB(c1);
  dest->red = (uchar)(int)(local_28 * 255.0 + 0.5);
  dest->green = (uchar)(int)(local_20 * 255.0 + 0.5);
  dest->blue = (uchar)(int)(local_18 * 255.0 + 0.5);
  return;
}

Assistant:

typename enable_if_c<pixel_traits<P1>::rgb && pixel_traits<P2>::hsi>::type
        assign(P1& dest, const P2& src) 
        { 
            COLOUR c;
            HSL h;
            h.h = src.h;
            h.h = h.h/255.0*360;
            h.s = src.s/255.0;
            h.l = src.i/255.0;
            c = HSL2RGB(h);

            dest.red = static_cast<unsigned char>(c.r*255.0 + 0.5);
            dest.green = static_cast<unsigned char>(c.g*255.0 + 0.5);
            dest.blue = static_cast<unsigned char>(c.b*255.0 + 0.5);
        }